

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedigrees.c
# Opt level: O0

void save_pedigree_leaf_from_user_worker(__cilkrts_worker *w)

{
  long in_RDI;
  
  if (*(int *)(*(long *)(in_RDI + 0x38) + 0x88) != 2) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/pedigrees.c"
                  ,0x5c,"w->l->type == WORKER_USER");
  }
  if (*(long *)(*(long *)(in_RDI + 0x38) + 0x108) != 0) {
    **(undefined8 **)(*(long *)(in_RDI + 0x38) + 0x108) = *(undefined8 *)(in_RDI + 0x60);
    __cilkrts_set_tls_pedigree_leaf((__cilkrts_pedigree *)w);
    *(undefined8 *)(*(long *)(in_RDI + 0x38) + 0x108) = 0;
    return;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/pedigrees.c"
                ,0x61,"w->l->original_pedigree_leaf");
}

Assistant:

void save_pedigree_leaf_from_user_worker(__cilkrts_worker *w)
{
    CILK_ASSERT(w->l->type == WORKER_USER);

    // Existing leaf in tls should be for the current worker.
    // This assert is expensive to check though.
    // CILK_ASSERT(&w->pedigree == __cilkrts_get_tls_pedigree_leaf(0));
    CILK_ASSERT(w->l->original_pedigree_leaf);

    // w should finish with a pedigree node that points to 
    // the same root that we just looked up.

    // TODO: This assert should be valid.
    // But we are removing it now to make exceptions (without pedigrees) work.
    // Currently, reading the pedigree after an exception is caught
    // fails because the pedigree chain not restored correctly. 
    // CILK_ASSERT(w->l->original_pedigree_leaf->next == w->pedigree.parent);
    w->l->original_pedigree_leaf->rank = w->pedigree.rank;

    // Save that leaf pointer back into tls.
    __cilkrts_set_tls_pedigree_leaf(w->l->original_pedigree_leaf);
    // Null out worker's leaf for paranoia.
    w->l->original_pedigree_leaf = NULL;
}